

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl.c
# Opt level: O3

void uv_dlclose(uv_lib_t *lib)

{
  uv__free(lib->errmsg);
  lib->errmsg = (char *)0x0;
  if (lib->handle != (void *)0x0) {
    dlclose();
    lib->handle = (void *)0x0;
  }
  return;
}

Assistant:

void uv_dlclose(uv_lib_t* lib) {
  uv__free(lib->errmsg);
  lib->errmsg = NULL;

  if (lib->handle) {
    /* Ignore errors. No good way to signal them without leaking memory. */
    dlclose(lib->handle);
    lib->handle = NULL;
  }
}